

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::BinaryUpdate<unsigned_long,double,double,duckdb::RegrCountFunction>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  idx_t in_RCX;
  Vector *in_RDX;
  UnifiedVectorFormat *in_R8;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat *in_stack_ffffffffffffff20;
  SelectionVector *in_stack_ffffffffffffff38;
  SelectionVector *in_stack_ffffffffffffff40;
  unsigned_long *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  AggregateInputData *in_stack_ffffffffffffff58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff60;
  SelectionVector *in_stack_ffffffffffffff70;
  ValidityMask *in_stack_ffffffffffffff78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff80;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff20);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff20);
  Vector::ToUnifiedFormat(in_RDX,in_RCX,in_R8);
  Vector::ToUnifiedFormat(in_RDX,in_RCX,in_R8);
  UnifiedVectorFormat::GetData<double>(&local_78);
  UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)&stack0xffffffffffffff40);
  this = (UnifiedVectorFormat *)&local_78.validity;
  BinaryUpdateLoop<unsigned_long,double,double,duckdb::RegrCountFunction>
            ((double *)in_stack_ffffffffffffff60._M_pi,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
             (ValidityMask *)in_stack_ffffffffffffff80._M_pi);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}